

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

Error __thiscall asmjit::CodeCompiler::setArg(CodeCompiler *this,uint32_t argIndex,Reg *r)

{
  long lVar1;
  ulong uVar2;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  VirtReg *vr;
  CCFunc *func;
  size_t index_1;
  size_t index;
  char *in_stack_000002e0;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  char *in_stack_fffffffffffffef8;
  Error error;
  CodeEmitter *in_stack_ffffffffffffff08;
  undefined4 local_cc;
  
  lVar1 = *(long *)(in_RDI + 0x188);
  error = (Error)((ulong)in_RDI >> 0x20);
  if (lVar1 == 0) {
    local_cc = CodeEmitter::setLastError(in_stack_ffffffffffffff08,error,in_stack_fffffffffffffef8);
  }
  else if ((ulong)(*(int *)(in_RDX + 4) - 0x100) < *(ulong *)(in_RDI + 0x1b8)) {
    if (*(int *)(in_RDX + 4) == -1) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    uVar2 = (ulong)(*(int *)(in_RDX + 4) - 0x100);
    if (*(ulong *)(in_RDI + 0x1b8) <= uVar2) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    if (*(ulong *)(in_RDI + 0x1b8) <= uVar2) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    if (*(byte *)(lVar1 + 0x80) <= in_ESI) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    *(undefined8 *)(*(long *)(lVar1 + 0x150) + (ulong)in_ESI * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + uVar2 * 8);
    local_cc = 0;
  }
  else {
    local_cc = CodeEmitter::setLastError(in_stack_ffffffffffffff08,error,in_stack_fffffffffffffef8);
  }
  return local_cc;
}

Assistant:

Error CodeCompiler::setArg(uint32_t argIndex, const Reg& r) {
  CCFunc* func = getFunc();

  if (!func)
    return setLastError(DebugUtils::errored(kErrorInvalidState));

  if (!isVirtRegValid(r))
    return setLastError(DebugUtils::errored(kErrorInvalidVirtId));

  VirtReg* vr = getVirtReg(r);
  func->setArg(argIndex, vr);

  return kErrorOk;
}